

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O0

void __thiscall
IntrusiveList<ExprVariableDefinition>::push_back
          (IntrusiveList<ExprVariableDefinition> *this,ExprVariableDefinition *node)

{
  ExprVariableDefinition *node_local;
  IntrusiveList<ExprVariableDefinition> *this_local;
  
  if (node == (ExprVariableDefinition *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0xf,
                  "void IntrusiveList<ExprVariableDefinition>::push_back(T *) [T = ExprVariableDefinition]"
                 );
  }
  if ((node->super_ExprBase).next == (ExprBase *)0x0) {
    if ((((node->super_ExprBase).listed ^ 0xffU) & 1) == 0) {
      __assert_fail("!node->listed",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                    ,0x11,
                    "void IntrusiveList<ExprVariableDefinition>::push_back(T *) [T = ExprVariableDefinition]"
                   );
    }
    (node->super_ExprBase).listed = true;
    if (this->head == (ExprVariableDefinition *)0x0) {
      this->tail = node;
      this->head = node;
    }
    else {
      (this->tail->super_ExprBase).next = &node->super_ExprBase;
      this->tail = node;
    }
    return;
  }
  __assert_fail("node->next == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x10,
                "void IntrusiveList<ExprVariableDefinition>::push_back(T *) [T = ExprVariableDefinition]"
               );
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}